

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

int Gia_ManPrintEdges(Gia_Man_t *p)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  printf("Edges (Q=2)    :                ");
  lVar2 = (long)p->vEdge1->nSize;
  iVar1 = 0;
  if (0 < lVar2) {
    lVar4 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(0 < p->vEdge1->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  lVar2 = (long)p->vEdge2->nSize;
  if (0 < lVar2) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(0 < p->vEdge2->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  printf("edge =%8d  ",(ulong)(uint)((iVar3 + iVar1) / 2));
  iVar1 = Gia_ManEvalEdgeDelay(p);
  printf("lev =%5.1f",(double)iVar1 * 0.1);
  putchar(10);
  return 0;
}

Assistant:

int Gia_ManPrintEdges( Gia_Man_t * p )
{
    printf( "Edges (Q=2)    :                " );
    printf( "edge =%8d  ", (Vec_IntCountPositive(p->vEdge1) + Vec_IntCountPositive(p->vEdge2))/2 );
    printf( "lev =%5.1f",  0.1*Gia_ManEvalEdgeDelay(p) );
    printf( "\n" );
    return 0;
}